

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

Hospital * __thiscall Hospital::Getter_Username_abi_cxx11_(Hospital *this)

{
  string *in_RSI;
  Hospital *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

string Hospital ::Getter_Username(){
    return Admin_Username;
}